

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlDocPtr xmlTextReaderCurrentDoc(xmlTextReaderPtr reader)

{
  xmlTextReaderPtr reader_local;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else if (reader->doc == (xmlDocPtr)0x0) {
    if ((reader->ctxt == (xmlParserCtxtPtr)0x0) || (reader->ctxt->myDoc == (xmlDocPtr)0x0)) {
      reader_local = (xmlTextReaderPtr)0x0;
    }
    else {
      reader->preserve = 1;
      reader_local = (xmlTextReaderPtr)reader->ctxt->myDoc;
    }
  }
  else {
    reader_local = (xmlTextReaderPtr)reader->doc;
  }
  return (xmlDocPtr)reader_local;
}

Assistant:

xmlDocPtr
xmlTextReaderCurrentDoc(xmlTextReaderPtr reader) {
    if (reader == NULL)
	return(NULL);
    if (reader->doc != NULL)
        return(reader->doc);
    if ((reader->ctxt == NULL) || (reader->ctxt->myDoc == NULL))
	return(NULL);

    reader->preserve = 1;
    return(reader->ctxt->myDoc);
}